

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  const_reference ppLVar3;
  undefined8 *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  Option opt_g_1;
  Layer *op;
  Mat top_blob_g;
  Mat bottom_blob_bordered_g;
  int g_3;
  int num_output_g;
  int channels_g;
  float top_rescale;
  int g_2;
  vector<float,_std::allocator<float>_> dequantize_scales;
  float scale_out;
  float scale_in;
  int g_1;
  vector<float,_std::allocator<float>_> requantize_scales;
  size_t out_elemsize;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  Option opt_g;
  int g;
  int channels_g_1;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Option *in_stack_00000558;
  float in_stack_00000564;
  Mat *in_stack_00000568;
  Mat *in_stack_00000570;
  Mat *in_stack_fffffffffffffc40;
  value_type_conflict4 *in_stack_fffffffffffffc48;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc50;
  Mat *in_stack_fffffffffffffc58;
  Mat *in_stack_fffffffffffffc60;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc88;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc90;
  undefined4 local_308;
  undefined4 uStack_304;
  Allocator *pAStack_300;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  Mat *in_stack_fffffffffffffd18;
  ConvolutionDepthWise *in_stack_fffffffffffffd20;
  undefined1 local_2d0 [24];
  Option *in_stack_fffffffffffffd48;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd50;
  Mat *in_stack_fffffffffffffd58;
  Mat *in_stack_fffffffffffffd60;
  Mat *in_stack_fffffffffffffd68;
  Mat *in_stack_fffffffffffffd70;
  Mat *in_stack_fffffffffffffd78;
  Mat *in_stack_fffffffffffffd80;
  Mat *in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  int local_24c;
  int local_20c;
  int local_1b4;
  Mat local_188 [3];
  undefined8 local_c8;
  Allocator *pAStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  Mat local_88;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  Mat *local_20;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  local_44 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) + -1) + 1;
  local_48 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) + -1) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_88,in_RSI);
  if (local_40 != 1) {
    Mat::create(in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                (int)in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                (size_t)in_stack_fffffffffffffc48,(Allocator *)in_stack_fffffffffffffc40);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
      local_98 = 1;
      goto LAB_001a696c;
    }
    local_9c = local_34 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
    for (local_a0 = 0; local_a0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
        local_a0 = local_a0 + 1) {
      local_a8 = local_28[4];
      local_b8 = local_28[2];
      uStack_b0 = local_28[3];
      local_c8 = CONCAT44(1,(int)*local_28);
      pAStack_c0 = local_88.allocator;
      Mat::channel_range(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                         (int)in_stack_fffffffffffffc50);
      Mat::channel_range(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                         (int)in_stack_fffffffffffffc50);
      Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x200),(long)local_a0);
      quantize_float32_to_int8
                (in_stack_00000570,in_stack_00000568,in_stack_00000564,in_stack_00000558);
      Mat::~Mat((Mat *)0x1a5aed);
      Mat::~Mat((Mat *)0x1a5afa);
    }
  }
  Mat::Mat(local_188);
  ConvolutionDepthWise::make_padding
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (Mat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (Option *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  bVar1 = Mat::empty(in_stack_fffffffffffffc40);
  if (bVar1) {
    local_4 = -100;
    local_98 = 1;
  }
  else {
    local_2c = local_188[0].w;
    local_30 = local_188[0].h;
    Mat::create(in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                (int)in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                (size_t)in_stack_fffffffffffffc48,(Allocator *)in_stack_fffffffffffffc40);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
      local_98 = 1;
    }
    else {
      if ((local_34 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8))) {
        if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x244) & 1) == 0) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)0x1a62cf);
          for (local_20c = 0; local_20c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)
              ; local_20c = local_20c + 1) {
            Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x200),
                            (long)local_20c);
            Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                            (long)local_20c);
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          }
          if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1)))) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1)) {
            in_stack_fffffffffffffc58 = local_20;
            std::vector<float,_std::allocator<float>_>::vector
                      (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            convdw3x3s1_int8_dequant_sse
                      (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60
                       ,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                       in_stack_fffffffffffffd48);
            std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc50);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
            local_4 = 0;
            local_98 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 2 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1)))))) {
            in_stack_fffffffffffffc50 =
                 (vector<float,_std::allocator<float>_> *)
                 ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x180);
            std::vector<float,_std::allocator<float>_>::vector
                      (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            convdw3x3s2_int8_dequant_sse
                      (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70
                       ,in_stack_fffffffffffffd68,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd60,
                       (Option *)in_stack_fffffffffffffd58);
            std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc50);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
            local_4 = 0;
            local_98 = 1;
          }
          else {
            local_98 = 0;
          }
          std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc50);
        }
        else {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)0x1a5d8c);
          for (local_1b4 = 0; local_1b4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)
              ; local_1b4 = local_1b4 + 1) {
            pfVar2 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                                     (long)local_1b4);
            if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
              Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x200),
                              (long)local_1b4);
              Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                              (long)local_1b4);
            }
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1)))))) {
            std::vector<float,_std::allocator<float>_>::vector
                      (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            convdw3x3s1_int8_requant_sse
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd78,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
                       (Option *)in_stack_fffffffffffffd68);
            std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc50);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
            local_4 = 0;
            local_98 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2)))))) {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)
                       ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140),
                       (vector<float,_std::allocator<float>_> *)local_20);
            convdw3x3s2_int8_requant_sse
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd78,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
                       (Option *)in_stack_fffffffffffffd68);
            std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc50);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
            local_4 = 0;
            local_98 = 1;
          }
          else {
            local_98 = 0;
          }
          std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc50);
        }
        if (local_98 != 0) goto LAB_001a694e;
      }
      for (local_24c = 0; local_24c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
          local_24c = local_24c + 1) {
        Mat::channel_range(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20)
                           ,(int)in_stack_fffffffffffffc50);
        Mat::channel_range(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20)
                           ,(int)in_stack_fffffffffffffc50);
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                             (long)local_24c);
        local_308 = *(undefined4 *)local_28;
        uStack_304 = *(undefined4 *)((long)local_28 + 4);
        pAStack_300 = local_20->allocator;
        (*(*ppLVar3)->_vptr_Layer[7])(*ppLVar3,&stack0xfffffffffffffd70,local_2d0,&local_308);
        Mat::~Mat((Mat *)0x1a68cf);
        Mat::~Mat((Mat *)0x1a68dc);
      }
      local_4 = 0;
      local_98 = 1;
    }
  }
LAB_001a694e:
  Mat::~Mat((Mat *)0x1a695b);
LAB_001a696c:
  Mat::~Mat((Mat *)0x1a6979);
  return local_4;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_requantize)
        {
            std::vector<float> requantize_scales;
            for (int g=0; g<group; g++)
            {
                float scale_in;
                if (weight_data_int8_scales[g] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int g=0; g<group; g++)
            {
                float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                dequantize_scales.push_back(top_rescale);
            }

            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}